

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::GetSseSum8x8QuadTest_DISABLED_Speed_Test::TestBody
          (GetSseSum8x8QuadTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  double dVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  int j_1;
  long lVar7;
  long lVar8;
  long lVar9;
  int j;
  long lVar10;
  int sum_tot_simd;
  uint sse_tot_simd;
  uint sse_tot_c;
  int64_t local_c8;
  int sum_tot_c;
  int sum1 [4];
  uint var2 [4];
  uint var1 [4];
  uint sse2 [4];
  uint sse1 [4];
  aom_usec_timer timer;
  int sum2 [4];
  
  iVar1 = (this->super_GetSseSum8x8QuadTest).params_.block_size;
  this_00 = &(this->super_GetSseSum8x8QuadTest).rnd_;
  iVar4 = iVar1;
  for (lVar10 = 0; lVar10 < iVar4; lVar10 = lVar10 + 1) {
    uVar3 = libaom_test::ACMRandom::Rand8(this_00);
    (this->super_GetSseSum8x8QuadTest).src_[lVar10] = uVar3;
    uVar3 = libaom_test::ACMRandom::Rand8(this_00);
    (this->super_GetSseSum8x8QuadTest).ref_[lVar10] = uVar3;
    iVar4 = (this->super_GetSseSum8x8QuadTest).params_.block_size;
  }
  iVar4 = (int)(1000000000 / (long)iVar1);
  sse1[0] = 0;
  sse1[1] = 0;
  sse1[2] = 0;
  sse1[3] = 0;
  sse2[0] = 0;
  sse2[1] = 0;
  sse2[2] = 0;
  sse2[3] = 0;
  var1[0] = 0;
  var1[1] = 0;
  var1[2] = 0;
  var1[3] = 0;
  sse_tot_c = 0;
  var2[0] = 0;
  var2[1] = 0;
  var2[2] = 0;
  var2[3] = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum1[0] = 0;
  sum1[1] = 0;
  sum1[2] = 0;
  sum1[3] = 0;
  sum_tot_simd = 0;
  sum2[0] = 0;
  sum2[1] = 0;
  sum2[2] = 0;
  sum2[3] = 0;
  iVar1 = (this->super_GetSseSum8x8QuadTest).params_.width;
  ::aom_usec_timer_start(&timer);
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
    lVar9 = 0;
    for (lVar10 = 0; lVar10 < (this->super_GetSseSum8x8QuadTest).params_.height; lVar10 = lVar10 + 8
        ) {
      lVar8 = lVar9;
      for (lVar7 = 0; lVar7 < (this->super_GetSseSum8x8QuadTest).params_.width; lVar7 = lVar7 + 0x20
          ) {
        aom_get_var_sse_sum_8x8_quad_c
                  ((this->super_GetSseSum8x8QuadTest).src_ + lVar8,iVar1,
                   (this->super_GetSseSum8x8QuadTest).ref_ + lVar8,iVar1,sse2,sum2,&sse_tot_c,
                   &sum_tot_c,var2);
        lVar8 = lVar8 + 0x20;
      }
      lVar9 = lVar9 + (long)iVar1 * 8;
    }
  }
  ::aom_usec_timer_mark(&timer);
  local_c8 = ::aom_usec_timer_elapsed(&timer);
  ::aom_usec_timer_start(&timer);
  for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
    lVar9 = 0;
    for (lVar10 = 0; lVar10 < (this->super_GetSseSum8x8QuadTest).params_.height; lVar10 = lVar10 + 8
        ) {
      lVar8 = lVar9;
      for (lVar7 = 0; lVar7 < (this->super_GetSseSum8x8QuadTest).params_.width; lVar7 = lVar7 + 0x20
          ) {
        (*(this->super_GetSseSum8x8QuadTest).params_.func)
                  ((this->super_GetSseSum8x8QuadTest).src_ + lVar8,iVar1,
                   (this->super_GetSseSum8x8QuadTest).ref_ + lVar8,iVar1,sse1,sum1,&sse_tot_simd,
                   &sum_tot_simd,var1);
        lVar8 = lVar8 + 0x20;
      }
      lVar9 = lVar9 + (long)iVar1 * 8;
    }
  }
  dVar2 = (double)local_c8;
  ::aom_usec_timer_mark(&timer);
  iVar6 = ::aom_usec_timer_elapsed(&timer);
  printf("aom_getvar_8x8_quad for block=%dx%d : ref_time=%lf \t simd_time=%lf \t gain=%lf \n",
         SUB84(dVar2,0),(double)iVar6,dVar2 / (double)iVar6,
         (ulong)(uint)(this->super_GetSseSum8x8QuadTest).params_.width,
         (ulong)(uint)(this->super_GetSseSum8x8QuadTest).params_.height);
  return;
}

Assistant:

TEST_P(GetSseSum8x8QuadTest, DISABLED_Speed) { SseSum_SpeedTest(); }